

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_7::Validator::BeginIfExpr(Validator *this,IfExpr *expr)

{
  Location *loc;
  
  loc = &(expr->super_ExprMixin<(wabt::ExprType)19>).super_Expr.loc;
  this->expr_loc_ = loc;
  CheckBlockDeclaration(this,loc,(Opcode)0x4,&(expr->true_).decl);
  TypeChecker::OnIf(&this->typechecker_,&(expr->true_).decl.sig.param_types,
                    &(expr->true_).decl.sig.result_types);
  return (Result)Ok;
}

Assistant:

Result Validator::BeginIfExpr(IfExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckBlockDeclaration(&expr->loc, Opcode::If, &expr->true_.decl);
  typechecker_.OnIf(expr->true_.decl.sig.param_types,
                    expr->true_.decl.sig.result_types);
  return Result::Ok;
}